

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_strtype.cc
# Opt level: O2

void __thiscall StringType::~StringType(StringType *this)

{
  (this->super_Type).super_DataDepElement._vptr_DataDepElement =
       (_func_int **)&PTR__StringType_001419f8;
  if (this->string_length_var_field_ != (Field *)0x0) {
    (*(this->string_length_var_field_->super_DataDepElement)._vptr_DataDepElement[1])();
  }
  if (this->elem_datatype_ != (Type *)0x0) {
    (*(this->elem_datatype_->super_DataDepElement)._vptr_DataDepElement[1])();
  }
  Type::~Type(&this->super_Type);
  return;
}

Assistant:

StringType::~StringType()
	{
	// TODO: Unref for Objects
	// Question: why Unref?
	//
	// Unref(str_);
	// Unref(regex_);

	delete string_length_var_field_;
	delete elem_datatype_;
	}